

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::adopt
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,
               OrphanBuilder *value)

{
  SegmentBuilder *srcSegment;
  OrphanBuilder *dst;
  CapTableBuilder *dstSegment;
  bool bVar1;
  BuilderArena *pBVar2;
  BuilderArena *pBVar3;
  WirePointer *pWVar4;
  bool local_7d;
  Fault local_70;
  Fault f;
  SegmentBuilder **local_60;
  DebugComparison<capnp::_::SegmentBuilder_*&,_std::nullptr_t> local_58;
  bool local_29;
  OrphanBuilder *pOStack_28;
  bool _kjCondition;
  OrphanBuilder *value_local;
  WirePointer *ref_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  
  pOStack_28 = value;
  value_local = (OrphanBuilder *)ref;
  ref_local = (WirePointer *)capTable;
  capTable_local = (CapTableBuilder *)segment;
  local_60 = (SegmentBuilder **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&value->segment);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::SegmentBuilder*&>::operator==
            (&local_58,(DebugExpression<capnp::_::SegmentBuilder*&> *)&local_60,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_58);
  local_7d = true;
  if (!bVar1) {
    pBVar2 = SegmentBuilder::getArena(pOStack_28->segment);
    pBVar3 = SegmentBuilder::getArena((SegmentBuilder *)capTable_local);
    local_7d = pBVar2 == pBVar3;
  }
  local_29 = local_7d;
  if (local_7d == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[46]>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x840,FAILED,
               "value.segment == nullptr || value.segment->getArena() == segment->getArena()",
               "_kjCondition,\"Adopted object must live in the same message.\"",&local_29,
               (char (*) [46])"Adopted object must live in the same message.");
    kj::_::Debug::Fault::fatal(&local_70);
  }
  bVar1 = WirePointer::isNull((WirePointer *)value_local);
  if (!bVar1) {
    zeroObject((SegmentBuilder *)capTable_local,(CapTableBuilder *)ref_local,
               (WirePointer *)value_local);
  }
  bVar1 = OrphanBuilder::operator==(pOStack_28,(void *)0x0);
  if (bVar1) {
    zeroMemory((WirePointer *)value_local);
  }
  else {
    pWVar4 = OrphanBuilder::tagAsPtr(pOStack_28);
    bVar1 = WirePointer::isPositional(pWVar4);
    dstSegment = capTable_local;
    dst = value_local;
    if (bVar1) {
      srcSegment = pOStack_28->segment;
      pWVar4 = OrphanBuilder::tagAsPtr(pOStack_28);
      transferPointer((SegmentBuilder *)dstSegment,(WirePointer *)dst,srcSegment,pWVar4,
                      pOStack_28->location);
    }
    else {
      pWVar4 = OrphanBuilder::tagAsPtr(pOStack_28);
      copyMemory<capnp::_::WirePointer>((WirePointer *)dst,pWVar4);
    }
  }
  pWVar4 = OrphanBuilder::tagAsPtr(pOStack_28);
  zeroMemory(pWVar4);
  pOStack_28->location = (word *)0x0;
  pOStack_28->segment = (SegmentBuilder *)0x0;
  return;
}

Assistant:

static void adopt(SegmentBuilder* segment, CapTableBuilder* capTable,
                    WirePointer* ref, OrphanBuilder&& value) {
    KJ_REQUIRE(value.segment == nullptr || value.segment->getArena() == segment->getArena(),
               "Adopted object must live in the same message.");

    if (!ref->isNull()) {
      zeroObject(segment, capTable, ref);
    }

    if (value == nullptr) {
      // Set null.
      zeroMemory(ref);
    } else if (value.tagAsPtr()->isPositional()) {
      WireHelpers::transferPointer(segment, ref, value.segment, value.tagAsPtr(), value.location);
    } else {
      // FAR and OTHER pointers are position-independent, so we can just copy.
      copyMemory(ref, value.tagAsPtr());
    }

    // Take ownership away from the OrphanBuilder.
    zeroMemory(value.tagAsPtr());
    value.location = nullptr;
    value.segment = nullptr;
  }